

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O0

void kratos::copy_attrs(Var *src,Var *target)

{
  bool bVar1;
  vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
  *this;
  reference attribute;
  shared_ptr<kratos::Attribute> *attr;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
  *__range1;
  vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
  *attributes;
  Var *target_local;
  Var *src_local;
  
  this = IRNode::get_attributes(&src->super_IRNode);
  __end1 = std::
           vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
           ::begin(this);
  attr = (shared_ptr<kratos::Attribute> *)
         std::
         vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
         ::end(this);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::shared_ptr<kratos::Attribute>_*,_std::vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>_>
                                *)&attr);
    if (!bVar1) break;
    attribute = __gnu_cxx::
                __normal_iterator<const_std::shared_ptr<kratos::Attribute>_*,_std::vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>_>
                ::operator*(&__end1);
    IRNode::add_attribute(&target->super_IRNode,attribute);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<kratos::Attribute>_*,_std::vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void copy_attrs(const Var& src, Var& target) {
    auto const& attributes = src.get_attributes();
    for (auto const& attr : attributes) {
        target.add_attribute(attr);
    }
}